

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

MTBDD mtbdd_enum_first(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  int iVar2;
  MTBDD MVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (dd & 0xffffffffff) * 0x10;
  while( true ) {
    if (dd == 0) {
      return 0;
    }
    if (((dd & 0x7fffffffffffffff) == 0) || ((nodes->data[lVar4 + 7] & 0x40) != 0)) {
      if ((filter_cb != (mtbdd_enum_filter_cb)0x0) && (iVar2 = (*filter_cb)(dd), iVar2 == 0)) {
        return 0;
      }
      for (; variables != 0x8000000000000000;
          variables = variables & 0x8000000000000000 ^
                      *(ulong *)(nodes->data + (variables & 0xffffffffff) * 0x10) &
                      0x800000ffffffffff) {
        *arr = '\x02';
        arr = arr + 1;
      }
      return dd;
    }
    if (variables == 0x8000000000000000) break;
    puVar1 = nodes->data;
    lVar5 = (variables & 0xffffffffff) * 0x10;
    variables = variables & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar5) & 0x800000ffffffffff;
    if ((*(ulong *)(puVar1 + lVar5 + 8) ^ *(ulong *)(puVar1 + lVar4 + 8)) < 0x10000000000) {
      MVar3 = mtbdd_enum_first(*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff |
                               dd & 0x8000000000000000,variables,arr + 1,filter_cb);
      if (MVar3 != 0) {
        *arr = '\0';
        return MVar3;
      }
      MVar3 = mtbdd_enum_first(*(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff ^
                               dd & 0x8000000000000000,variables,arr + 1,filter_cb);
      if (MVar3 == 0) {
        return 0;
      }
      *arr = '\x01';
      return MVar3;
    }
    *arr = '\x02';
    arr = arr + 1;
  }
  if (filter_cb == (mtbdd_enum_filter_cb)0x0) {
    return dd;
  }
  iVar2 = (*filter_cb)(dd);
  if (iVar2 == 0) {
    return 0;
  }
  return dd;
}

Assistant:

MTBDD
mtbdd_enum_first(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf dd is skipped
        return mtbdd_false;
    } else if (mtbdd_isleaf(dd)) {
        // a leaf for which the filter returns 0 is skipped
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        // ok, we have a leaf that is not skipped, go for it!
        while (variables != mtbdd_true) {
            *arr++ = 2;
            variables = mtbdd_gethigh(variables);
        }
        return dd;
    } else if (variables == mtbdd_true) {
        // in the case of partial evaluation... treat like a leaf
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        return dd;
    } else {
        // if variables == true, then dd must be a leaf. But then this line is unreachable.
        // if this assertion fails, then <variables> is not the support of <dd>.
        assert(variables != mtbdd_true);

        // get next variable from <variables>
        uint32_t v = mtbdd_getvar(variables);
        variables = mtbdd_gethigh(variables);

        // check if MTBDD is on this variable
        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_getvariable(n) != v) {
            *arr = 2;
            return mtbdd_enum_first(dd, variables, arr+1, filter_cb);
        }

        // first maybe follow low
        MTBDD res = mtbdd_enum_first(node_getlow(dd, n), variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 0;
            return res;
        }

        // if not low, try following high
        res = mtbdd_enum_first(node_gethigh(dd, n), variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 1;
            return res;
        }
        
        // we've tried low and high, return false
        return mtbdd_false;
    }
}